

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_tpl.h
# Opt level: O1

uint32_t longest_match_avx2(deflate_state *s,Pos cur_match)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  Pos *pPVar4;
  long lVar5;
  undefined1 auVar6 [32];
  uint uVar7;
  undefined1 (*pauVar8) [32];
  char cVar9;
  ulong uVar10;
  undefined1 (*pauVar11) [32];
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uchar *puVar15;
  uint uVar16;
  uint uVar17;
  ushort uVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  bool bVar23;
  uint local_7c;
  uint local_74;
  ulong local_48;
  
  uVar12 = (ulong)cur_match;
  uVar1 = s->strstart;
  uVar21 = (ulong)uVar1;
  puVar3 = s->window;
  uVar16 = 2;
  if (s->prev_length != 0) {
    uVar16 = s->prev_length;
  }
  uVar17 = 0xffffffff;
  if (3 < uVar16) {
    uVar17 = (uint)(uVar16 < 8) << 2 | 0xfffffff9;
  }
  uVar10 = *(ulong *)(puVar3 + (uVar17 + uVar16) + uVar21);
  local_74 = (uint)(uVar10 >> 0x10) & 0xffff;
  local_48 = uVar10 >> 0x20;
  puVar15 = puVar3 + (uVar17 + uVar16);
  uVar17 = s->max_chain_length >> 2;
  if (uVar16 < s->good_match) {
    uVar17 = s->max_chain_length;
  }
  uVar7 = s->w_size - 0x106;
  uVar2 = s->w_mask;
  uVar13 = uVar1 - uVar7;
  uVar19 = uVar13 & 0xffff;
  if (uVar1 < uVar7 || uVar13 == 0) {
    uVar19 = 0;
  }
  pPVar4 = s->prev;
  lVar5 = *(long *)(((undefined1 (*) [32])(puVar3 + uVar21 + 2))[-1] + 0x1e);
  do {
    if (uVar1 <= (uint)uVar12) goto LAB_001173ba;
    uVar18 = (ushort)uVar19;
    if (uVar16 < 4) {
      while ((*(short *)(puVar15 + uVar12) != (short)uVar10 ||
             (*(short *)(puVar3 + uVar12) != (short)lVar5))) {
        if (uVar17 == 1) goto LAB_001173ba;
        uVar7 = (uint)uVar12;
        uVar12 = (ulong)pPVar4[uVar7 & uVar2];
        uVar17 = uVar17 - 1;
        if (pPVar4[uVar7 & uVar2] <= uVar18) goto LAB_001173ba;
      }
    }
    else if (uVar16 < 8) {
      while ((*(uint *)(puVar15 + uVar12) != (local_74 << 0x10 | (uint)(uVar10 & 0xffff)) ||
             (*(int *)(puVar3 + uVar12) != (int)lVar5))) {
        if (uVar17 == 1) goto LAB_001173ba;
        uVar7 = (uint)uVar12;
        uVar12 = (ulong)pPVar4[uVar7 & uVar2];
        uVar17 = uVar17 - 1;
        if (pPVar4[uVar7 & uVar2] <= uVar18) goto LAB_001173ba;
      }
    }
    else {
      while ((*(ulong *)(puVar15 + uVar12) !=
              (local_48 << 0x20 | uVar10 & 0xffff | (ulong)(local_74 << 0x10)) ||
             (*(long *)(puVar3 + uVar12) != lVar5))) {
        if (uVar17 == 1) goto LAB_001173ba;
        uVar7 = (uint)uVar12;
        uVar12 = (ulong)pPVar4[uVar7 & uVar2];
        uVar17 = uVar17 - 1;
        if (pPVar4[uVar7 & uVar2] <= uVar18) goto LAB_001173ba;
      }
    }
    pauVar8 = (undefined1 (*) [32])(puVar3 + uVar12 + 2);
    uVar7 = 0;
    pauVar11 = (undefined1 (*) [32])(puVar3 + uVar21 + 2);
    uVar22 = uVar21;
    do {
      auVar6 = vpcmpeqb_avx2(*pauVar11,*pauVar8);
      uVar13 = (uint)(SUB321(auVar6 >> 7,0) & 1) | (uint)(SUB321(auVar6 >> 0xf,0) & 1) << 1 |
               (uint)(SUB321(auVar6 >> 0x17,0) & 1) << 2 | (uint)(SUB321(auVar6 >> 0x1f,0) & 1) << 3
               | (uint)(SUB321(auVar6 >> 0x27,0) & 1) << 4 |
               (uint)(SUB321(auVar6 >> 0x2f,0) & 1) << 5 | (uint)(SUB321(auVar6 >> 0x37,0) & 1) << 6
               | (uint)(SUB321(auVar6 >> 0x3f,0) & 1) << 7 |
               (uint)(SUB321(auVar6 >> 0x47,0) & 1) << 8 | (uint)(SUB321(auVar6 >> 0x4f,0) & 1) << 9
               | (uint)(SUB321(auVar6 >> 0x57,0) & 1) << 10 |
               (uint)(SUB321(auVar6 >> 0x5f,0) & 1) << 0xb |
               (uint)(SUB321(auVar6 >> 0x67,0) & 1) << 0xc |
               (uint)(SUB321(auVar6 >> 0x6f,0) & 1) << 0xd |
               (uint)(SUB321(auVar6 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar6 >> 0x7f,0) << 0xf |
               (uint)(SUB321(auVar6 >> 0x87,0) & 1) << 0x10 |
               (uint)(SUB321(auVar6 >> 0x8f,0) & 1) << 0x11 |
               (uint)(SUB321(auVar6 >> 0x97,0) & 1) << 0x12 |
               (uint)(SUB321(auVar6 >> 0x9f,0) & 1) << 0x13 |
               (uint)(SUB321(auVar6 >> 0xa7,0) & 1) << 0x14 |
               (uint)(SUB321(auVar6 >> 0xaf,0) & 1) << 0x15 |
               (uint)(SUB321(auVar6 >> 0xb7,0) & 1) << 0x16 | (uint)SUB321(auVar6 >> 0xbf,0) << 0x17
               | (uint)(SUB321(auVar6 >> 199,0) & 1) << 0x18 |
               (uint)(SUB321(auVar6 >> 0xcf,0) & 1) << 0x19 |
               (uint)(SUB321(auVar6 >> 0xd7,0) & 1) << 0x1a |
               (uint)(SUB321(auVar6 >> 0xdf,0) & 1) << 0x1b |
               (uint)(SUB321(auVar6 >> 0xe7,0) & 1) << 0x1c |
               (uint)(SUB321(auVar6 >> 0xef,0) & 1) << 0x1d |
               (uint)(SUB321(auVar6 >> 0xf7,0) & 1) << 0x1e |
               (uint)(byte)(auVar6[0x1f] >> 7) << 0x1f;
      if (uVar13 == 0xffffffff) {
        auVar6 = vpcmpeqb_avx2(pauVar11[1],pauVar8[1]);
        uVar13 = (uint)(SUB321(auVar6 >> 7,0) & 1) | (uint)(SUB321(auVar6 >> 0xf,0) & 1) << 1 |
                 (uint)(SUB321(auVar6 >> 0x17,0) & 1) << 2 |
                 (uint)(SUB321(auVar6 >> 0x1f,0) & 1) << 3 |
                 (uint)(SUB321(auVar6 >> 0x27,0) & 1) << 4 |
                 (uint)(SUB321(auVar6 >> 0x2f,0) & 1) << 5 |
                 (uint)(SUB321(auVar6 >> 0x37,0) & 1) << 6 |
                 (uint)(SUB321(auVar6 >> 0x3f,0) & 1) << 7 |
                 (uint)(SUB321(auVar6 >> 0x47,0) & 1) << 8 |
                 (uint)(SUB321(auVar6 >> 0x4f,0) & 1) << 9 |
                 (uint)(SUB321(auVar6 >> 0x57,0) & 1) << 10 |
                 (uint)(SUB321(auVar6 >> 0x5f,0) & 1) << 0xb |
                 (uint)(SUB321(auVar6 >> 0x67,0) & 1) << 0xc |
                 (uint)(SUB321(auVar6 >> 0x6f,0) & 1) << 0xd |
                 (uint)(SUB321(auVar6 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar6 >> 0x7f,0) << 0xf
                 | (uint)(SUB321(auVar6 >> 0x87,0) & 1) << 0x10 |
                 (uint)(SUB321(auVar6 >> 0x8f,0) & 1) << 0x11 |
                 (uint)(SUB321(auVar6 >> 0x97,0) & 1) << 0x12 |
                 (uint)(SUB321(auVar6 >> 0x9f,0) & 1) << 0x13 |
                 (uint)(SUB321(auVar6 >> 0xa7,0) & 1) << 0x14 |
                 (uint)(SUB321(auVar6 >> 0xaf,0) & 1) << 0x15 |
                 (uint)(SUB321(auVar6 >> 0xb7,0) & 1) << 0x16 |
                 (uint)SUB321(auVar6 >> 0xbf,0) << 0x17 |
                 (uint)(SUB321(auVar6 >> 199,0) & 1) << 0x18 |
                 (uint)(SUB321(auVar6 >> 0xcf,0) & 1) << 0x19 |
                 (uint)(SUB321(auVar6 >> 0xd7,0) & 1) << 0x1a |
                 (uint)(SUB321(auVar6 >> 0xdf,0) & 1) << 0x1b |
                 (uint)(SUB321(auVar6 >> 0xe7,0) & 1) << 0x1c |
                 (uint)(SUB321(auVar6 >> 0xef,0) & 1) << 0x1d |
                 (uint)(SUB321(auVar6 >> 0xf7,0) & 1) << 0x1e |
                 (uint)(byte)(auVar6[0x1f] >> 7) << 0x1f;
        if (uVar13 == 0xffffffff) {
          pauVar11 = pauVar11 + 2;
          pauVar8 = pauVar8 + 2;
          uVar7 = uVar7 + 0x40;
          bVar23 = true;
        }
        else {
          pauVar11 = pauVar11 + 1;
          pauVar8 = pauVar8 + 1;
          uVar13 = ~uVar13;
          iVar20 = 0;
          if (uVar13 != 0) {
            for (; (uVar13 >> iVar20 & 1) == 0; iVar20 = iVar20 + 1) {
            }
          }
          uVar22 = (ulong)(iVar20 + uVar7 + 0x20);
          uVar7 = uVar7 + 0x20;
          bVar23 = false;
        }
      }
      else {
        uVar13 = ~uVar13;
        iVar20 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> iVar20 & 1) == 0; iVar20 = iVar20 + 1) {
          }
        }
        uVar22 = (ulong)(iVar20 + uVar7);
        bVar23 = false;
      }
      iVar20 = (int)uVar22;
      if (!bVar23) goto LAB_001172af;
    } while (uVar7 < 0x100);
    iVar20 = 0x100;
LAB_001172af:
    uVar7 = iVar20 + 2;
    uVar13 = (uint)uVar12;
    if (uVar16 < uVar7) {
      s->match_start = uVar13;
      if (s->lookahead < uVar7) {
        bVar23 = false;
        local_7c = s->lookahead;
      }
      else {
        uVar16 = uVar7;
        if (uVar7 < (uint)s->nice_match) {
          uVar14 = -(uint)(uVar7 < 8) | 0xfffffffb;
          if (uVar7 < 4) {
            uVar14 = 1;
          }
          uVar10 = *(ulong *)(puVar3 + (uVar14 + iVar20) + uVar21);
          local_74 = (uint)(uVar10 >> 0x10) & 0xffff;
          local_48 = uVar10 >> 0x20;
          puVar15 = puVar3 + (uVar14 + iVar20);
          bVar23 = true;
        }
        else {
          bVar23 = false;
          local_7c = uVar7;
        }
      }
      cVar9 = '\x01';
      if (bVar23) {
LAB_00117367:
        uVar17 = uVar17 - 1;
        if (uVar17 == 0) {
          cVar9 = '\x01';
          local_7c = uVar16;
        }
        else {
          uVar12 = (ulong)pPVar4[uVar13 & uVar2];
          bVar23 = uVar19 < pPVar4[uVar13 & uVar2];
          cVar9 = bVar23 * '\x02' + '\x01';
          if (!bVar23) {
            local_7c = uVar16;
          }
        }
      }
    }
    else {
      if (4 < s->level) goto LAB_00117367;
      cVar9 = '\x02';
    }
  } while (cVar9 == '\x03');
  if (cVar9 == '\x02') {
LAB_001173ba:
    local_7c = uVar16;
  }
  return local_7c;
}

Assistant:

Z_INTERNAL uint32_t LONGEST_MATCH(deflate_state *const s, Pos cur_match) {
    unsigned int strstart = s->strstart;
    const unsigned wmask = s->w_mask;
    unsigned char *window = s->window;
    unsigned char *scan = window + strstart;
    Z_REGISTER unsigned char *mbase_start = window;
    Z_REGISTER unsigned char *mbase_end;
    const Pos *prev = s->prev;
    Pos limit;
#ifdef LONGEST_MATCH_SLOW
    Pos limit_base;
#else
    int32_t early_exit;
#endif
    uint32_t chain_length, nice_match, best_len, offset;
    uint32_t lookahead = s->lookahead;
    Pos match_offset = 0;
    uint64_t scan_start;
    uint64_t scan_end;

#define GOTO_NEXT_CHAIN \
    if (--chain_length && (cur_match = prev[cur_match & wmask]) > limit) \
        continue; \
    return best_len;

    /* The code is optimized for STD_MAX_MATCH-2 multiple of 16. */
    Assert(STD_MAX_MATCH == 258, "Code too clever");

    best_len = s->prev_length ? s->prev_length : STD_MIN_MATCH-1;

    /* Calculate read offset which should only extend an extra byte
     * to find the next best match length.
     */
    offset = best_len-1;
    if (best_len >= sizeof(uint32_t)) {
        offset -= 2;
        if (best_len >= sizeof(uint64_t))
            offset -= 4;
    }

    scan_start = zng_memread_8(scan);
    scan_end = zng_memread_8(scan+offset);
    mbase_end  = (mbase_start+offset);

    /* Do not waste too much time if we already have a good match */
    chain_length = s->max_chain_length;
    if (best_len >= s->good_match)
        chain_length >>= 2;
    nice_match = (uint32_t)s->nice_match;

    /* Stop when cur_match becomes <= limit. To simplify the code,
     * we prevent matches with the string of window index 0
     */
    limit = strstart > MAX_DIST(s) ? (Pos)(strstart - MAX_DIST(s)) : 0;
#ifdef LONGEST_MATCH_SLOW
    limit_base = limit;
    if (best_len >= STD_MIN_MATCH) {
        /* We're continuing search (lazy evaluation). */
        uint32_t i, hash;
        Pos pos;

        /* Find a most distant chain starting from scan with index=1 (index=0 corresponds
         * to cur_match). We cannot use s->prev[strstart+1,...] immediately, because
         * these strings are not yet inserted into the hash table.
         */
        hash = s->update_hash(0, scan[1]);
        hash = s->update_hash(hash, scan[2]);

        for (i = 3; i <= best_len; i++) {
            hash = s->update_hash(hash, scan[i]);

            /* If we're starting with best_len >= 3, we can use offset search. */
            pos = s->head[hash];
            if (pos < cur_match) {
                match_offset = (Pos)(i - 2);
                cur_match = pos;
            }
        }

        /* Update offset-dependent variables */
        limit = limit_base+match_offset;
        if (cur_match <= limit)
            goto break_matching;
        mbase_start -= match_offset;
        mbase_end -= match_offset;
    }
#else
    early_exit = s->level < EARLY_EXIT_TRIGGER_LEVEL;
#endif
    Assert((unsigned long)strstart <= s->window_size - MIN_LOOKAHEAD, "need lookahead");
    for (;;) {
        if (cur_match >= strstart)
            break;

        /* Skip to next match if the match length cannot increase or if the match length is
         * less than 2. Note that the checks below for insufficient lookahead only occur
         * occasionally for performance reasons.
         * Therefore uninitialized memory will be accessed and conditional jumps will be made
         * that depend on those values. However the length of the match is limited to the
         * lookahead, so the output of deflate is not affected by the uninitialized values.
         */
        if (best_len < sizeof(uint32_t)) {
            for (;;) {
                if (zng_memcmp_2(mbase_end+cur_match, &scan_end) == 0 &&
                    zng_memcmp_2(mbase_start+cur_match, &scan_start) == 0)
                    break;
                GOTO_NEXT_CHAIN;
            }
        } else if (best_len >= sizeof(uint64_t)) {
            for (;;) {
                if (zng_memcmp_8(mbase_end+cur_match, &scan_end) == 0 &&
                    zng_memcmp_8(mbase_start+cur_match, &scan_start) == 0)
                    break;
                GOTO_NEXT_CHAIN;
            }
        } else {
            for (;;) {
                if (zng_memcmp_4(mbase_end+cur_match, &scan_end) == 0 &&
                    zng_memcmp_4(mbase_start+cur_match, &scan_start) == 0)
                    break;
                GOTO_NEXT_CHAIN;
            }
        }
        uint32_t len = COMPARE256(scan+2, mbase_start+cur_match+2) + 2;
        Assert(scan+len <= window+(unsigned)(s->window_size-1), "wild scan");

        if (len > best_len) {
            uint32_t match_start = cur_match - match_offset;
            s->match_start = match_start;

            /* Do not look for matches beyond the end of the input. */
            if (len > lookahead)
                return lookahead;
            best_len = len;
            if (best_len >= nice_match)
                return best_len;

            offset = best_len-1;
            if (best_len >= sizeof(uint32_t)) {
                offset -= 2;
                if (best_len >= sizeof(uint64_t))
                    offset -= 4;
            }

            scan_end = zng_memread_8(scan+offset);

#ifdef LONGEST_MATCH_SLOW
            /* Look for a better string offset */
            if (UNLIKELY(len > STD_MIN_MATCH && match_start + len < strstart)) {
                Pos pos, next_pos;
                uint32_t i, hash;
                unsigned char *scan_endstr;

                /* Go back to offset 0 */
                cur_match -= match_offset;
                match_offset = 0;
                next_pos = cur_match;
                for (i = 0; i <= len - STD_MIN_MATCH; i++) {
                    pos = prev[(cur_match + i) & wmask];
                    if (pos < next_pos) {
                        /* Hash chain is more distant, use it */
                        if (pos <= limit_base + i)
                            goto break_matching;
                        next_pos = pos;
                        match_offset = (Pos)i;
                    }
                }
                /* Switch cur_match to next_pos chain */
                cur_match = next_pos;

                /* Try hash head at len-(STD_MIN_MATCH-1) position to see if we could get
                 * a better cur_match at the end of string. Using (STD_MIN_MATCH-1) lets
                 * us include one more byte into hash - the byte which will be checked
                 * in main loop now, and which allows to grow match by 1.
                 */
                scan_endstr = scan + len - (STD_MIN_MATCH+1);

                hash = s->update_hash(0, scan_endstr[0]);
                hash = s->update_hash(hash, scan_endstr[1]);
                hash = s->update_hash(hash, scan_endstr[2]);

                pos = s->head[hash];
                if (pos < cur_match) {
                    match_offset = (Pos)(len - (STD_MIN_MATCH+1));
                    if (pos <= limit_base + match_offset)
                        goto break_matching;
                    cur_match = pos;
                }

                /* Update offset-dependent variables */
                limit = limit_base+match_offset;
                mbase_start = window-match_offset;
                mbase_end = (mbase_start+offset);
                continue;
            }
#endif
            mbase_end = (mbase_start+offset);
        }
#ifndef LONGEST_MATCH_SLOW
        else if (UNLIKELY(early_exit)) {
            /* The probability of finding a match later if we here is pretty low, so for
             * performance it's best to outright stop here for the lower compression levels
             */
            break;
        }
#endif
        GOTO_NEXT_CHAIN;
    }
    return best_len;

#ifdef LONGEST_MATCH_SLOW
break_matching:

    if (best_len < s->lookahead)
        return best_len;

    return s->lookahead;
#endif
}